

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfo *
embree::avx::createPrimRefArrayGrids
          (PrimInfo *__return_storage_ptr__,GridMesh *mesh,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SubGridBuildData *ptr;
  PrimRef *ptr_00;
  MemoryMonitorInterface *pMVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  PrimInfo *pPVar9;
  char cVar10;
  int iVar11;
  size_t i;
  task *ptVar12;
  size_t sVar13;
  SubGridBuildData *pSVar14;
  PrimRef *pPVar15;
  long lVar16;
  runtime_error *prVar17;
  ulong uVar18;
  size_t *psVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  ulong uVar22;
  unsigned_long end_1;
  _func_int **pp_Var23;
  unsigned_long end;
  bool bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  auto_partitioner local_2961;
  size_t taskCount;
  ulong local_2958 [2];
  ulong **local_2948;
  task_traits local_2940;
  uint geomID_;
  GridMesh *mesh_local;
  PrimInfo *local_2928;
  GridMesh **local_2920;
  mvector<PrimRef> *local_2918;
  mvector<SubGridBuildData> *local_2910;
  uint *local_2908;
  ulong *local_2900;
  ulong *local_28f8;
  size_t *local_28f0;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_28e8;
  GridMesh ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  local_2918 = (mvector<PrimRef> *)&geomID_;
  geomID_ = 0xffffffff;
  local_2920 = &mesh_local;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  uVar18 = (ulong)(mesh->super_Geometry).numPrimitives;
  local_2958[1] = 0;
  local_2958[0] = uVar18;
  mesh_local = mesh;
  iVar11 = tbb::detail::d1::max_concurrency();
  pp_Var20 = (_func_int **)(uVar18 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar11 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar11;
  }
  pp_Var23 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var23 = pp_Var20;
  }
  local_28f0 = &taskCount;
  local_2900 = local_2958 + 1;
  local_28f8 = local_2958;
  local_28e8 = &pstate;
  local_28e0 = &local_2920;
  taskCount = (size_t)pp_Var23;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2948 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2940.m_version_and_traits = 0;
    ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2940,0xc0);
    ptVar12->m_reserved[2] = 0;
    ptVar12->m_reserved[3] = 0;
    ptVar12->m_reserved[4] = 0;
    ptVar12->m_reserved[5] = 0;
    (ptVar12->super_task_traits).m_version_and_traits = 0;
    ptVar12->m_reserved[0] = 0;
    ptVar12->m_reserved[1] = 0;
    ptVar12->m_reserved[2] = 0;
    ptVar12->_vptr_task = (_func_int **)&PTR__task_021ef3e0;
    ptVar12[1]._vptr_task = pp_Var23;
    ptVar12[1].super_task_traits.m_version_and_traits = 0;
    ptVar12[1].m_reserved[0] = 1;
    ptVar12[1].m_reserved[1] = (uint64_t)&local_2948;
    ptVar12[1].m_reserved[2] = 0;
    ptVar12[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar12[1].m_reserved + 5),&local_2961);
    ptVar12[2].super_task_traits.m_version_and_traits = local_2940.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar12[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar12,&context,&local_28c8,&context);
  }
  cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar10 != '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"task cancelled");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  auVar26 = ZEXT816(0) << 0x40;
  psVar19 = &pstate.sums[0].begin;
  aVar30.m128[2] = INFINITY;
  aVar30._0_8_ = 0x7f8000007f800000;
  aVar30.m128[3] = INFINITY;
  aVar31.m128[2] = -INFINITY;
  aVar31._0_8_ = 0xff800000ff800000;
  aVar31.m128[3] = -INFINITY;
  sVar13 = taskCount;
  aVar28 = aVar30;
  aVar4 = aVar31;
  while (bVar24 = sVar13 != 0, sVar13 = sVar13 - 1, bVar24) {
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar19 + -8))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar28;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar19 + -6) = aVar4;
    (((BBox3fa *)(psVar19 + -4))->lower).field_0 = aVar30;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar19 + -2) = aVar31;
    *(undefined1 (*) [16])psVar19 = auVar26;
    aVar28.m128 = (__m128)vminps_avx(aVar28.m128,*(undefined1 (*) [16])(psVar19 + -0x288));
    aVar4.m128 = (__m128)vmaxps_avx(aVar4.m128,*(undefined1 (*) [16])(psVar19 + -0x286));
    aVar30.m128 = (__m128)vminps_avx(aVar30.m128,*(undefined1 (*) [16])(psVar19 + -0x284));
    aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,*(undefined1 (*) [16])(psVar19 + -0x282));
    auVar26 = vpaddq_avx(auVar26,*(undefined1 (*) [16])(psVar19 + -0x280));
    psVar19 = psVar19 + 10;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar28;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar4;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar31;
  __return_storage_ptr__->begin = auVar26._0_8_;
  __return_storage_ptr__->end = auVar26._8_8_;
  auVar5 = vshufps_avx(auVar26,auVar26,0xee);
  auVar26 = vpsubq_avx(auVar5,auVar26);
  uVar25 = auVar26._0_8_;
  uVar18 = sgrids->size_alloced;
  uVar22 = uVar18;
  if ((uVar18 < uVar25) && (uVar21 = uVar18, uVar22 = uVar25, uVar18 != 0)) {
    for (; uVar22 = uVar21, uVar21 < uVar25; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  if (uVar25 < sgrids->size_active) {
    sgrids->size_active = uVar25;
  }
  local_2928 = __return_storage_ptr__;
  if (uVar18 == uVar22) {
    sgrids->size_active = uVar25;
  }
  else {
    ptr = sgrids->items;
    if (uVar22 == 0) {
      uVar18 = 0;
LAB_00e317e9:
      pSVar14 = (SubGridBuildData *)alignedMalloc(uVar18,4);
    }
    else {
      pMVar3 = (sgrids->alloc).device;
      uVar18 = uVar22 * 8;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar18,0);
      if (uVar18 < 0x1c00000) goto LAB_00e317e9;
      pSVar14 = (SubGridBuildData *)os_malloc(uVar18,&(sgrids->alloc).hugepages);
    }
    sgrids->items = pSVar14;
    for (uVar18 = 0; uVar18 < sgrids->size_active; uVar18 = uVar18 + 1) {
      sgrids->items[uVar18] = ptr[uVar18];
    }
    sVar13 = sgrids->size_alloced;
    if (ptr != (SubGridBuildData *)0x0) {
      if (sVar13 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar13 * 8,(sgrids->alloc).hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13 * -8,1);
    }
    sgrids->size_active = uVar25;
    sgrids->size_alloced = uVar22;
  }
  uVar18 = prims->size_alloced;
  uVar22 = uVar18;
  if ((uVar18 < uVar25) && (uVar21 = uVar18, uVar22 = uVar25, uVar18 != 0)) {
    for (; uVar22 = uVar21, uVar21 < uVar25; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  if (uVar25 < prims->size_active) {
    prims->size_active = uVar25;
  }
  if (uVar18 == uVar22) {
    prims->size_active = uVar25;
    goto LAB_00e31968;
  }
  ptr_00 = prims->items;
  if (uVar22 == 0) {
    sVar13 = 0;
LAB_00e318dc:
    pPVar15 = (PrimRef *)alignedMalloc(sVar13,0x20);
  }
  else {
    pMVar3 = (prims->alloc).device;
    sVar13 = uVar22 << 5;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13,0);
    if (sVar13 < 0x1c00000) goto LAB_00e318dc;
    pPVar15 = (PrimRef *)os_malloc(sVar13,&(prims->alloc).hugepages);
  }
  prims->items = pPVar15;
  lVar16 = 0;
  for (uVar18 = 0; uVar18 < prims->size_active; uVar18 = uVar18 + 1) {
    puVar1 = (undefined8 *)((long)&(ptr_00->lower).field_0 + lVar16);
    uVar6 = puVar1[1];
    uVar7 = puVar1[2];
    uVar8 = puVar1[3];
    puVar2 = (undefined8 *)((long)&(prims->items->lower).field_0 + lVar16);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    puVar2[2] = uVar7;
    puVar2[3] = uVar8;
    lVar16 = lVar16 + 0x20;
  }
  sVar13 = prims->size_alloced;
  if (ptr_00 != (PrimRef *)0x0) {
    if (sVar13 << 5 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar13 << 5,(prims->alloc).hugepages);
    }
  }
  if (sVar13 != 0) {
    pMVar3 = (prims->alloc).device;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13 * -0x20,1);
  }
  prims->size_active = uVar25;
  prims->size_alloced = uVar22;
LAB_00e31968:
  uVar18 = (ulong)(mesh_local->super_Geometry).numPrimitives;
  local_2920 = &mesh_local;
  local_2908 = &geomID_;
  local_2958[1] = 0;
  local_2958[0] = uVar18;
  local_2918 = prims;
  local_2910 = sgrids;
  iVar11 = tbb::detail::d1::max_concurrency();
  pp_Var20 = (_func_int **)(uVar18 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar11 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar11;
  }
  pp_Var23 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var23 = pp_Var20;
  }
  local_2900 = local_2958 + 1;
  local_28f8 = local_2958;
  local_28f0 = &taskCount;
  local_28e8 = &pstate;
  local_28e0 = &local_2920;
  taskCount = (size_t)pp_Var23;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pPVar9 = local_2928;
  local_2948 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2940.m_version_and_traits = 0;
    ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2940,0xc0);
    ptVar12->m_reserved[2] = 0;
    ptVar12->m_reserved[3] = 0;
    ptVar12->m_reserved[4] = 0;
    ptVar12->m_reserved[5] = 0;
    (ptVar12->super_task_traits).m_version_and_traits = 0;
    ptVar12->m_reserved[0] = 0;
    ptVar12->m_reserved[1] = 0;
    ptVar12->m_reserved[2] = 0;
    ptVar12->_vptr_task = (_func_int **)&PTR__task_021ef428;
    ptVar12[1]._vptr_task = pp_Var23;
    ptVar12[1].super_task_traits.m_version_and_traits = 0;
    ptVar12[1].m_reserved[0] = 1;
    ptVar12[1].m_reserved[1] = (uint64_t)&local_2948;
    ptVar12[1].m_reserved[2] = 0;
    ptVar12[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar12[1].m_reserved + 5),&local_2961);
    ptVar12[2].super_task_traits.m_version_and_traits = local_2940.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar12[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar12,&context,&local_28c8,&context);
  }
  cVar10 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar10 != '\0') {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"task cancelled");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  aVar29.m128[2] = INFINITY;
  aVar29._0_8_ = 0x7f8000007f800000;
  aVar29.m128[3] = INFINITY;
  aVar28.m128[2] = -INFINITY;
  aVar28._0_8_ = 0xff800000ff800000;
  aVar28.m128[3] = -INFINITY;
  psVar19 = &pstate.sums[0].begin;
  aVar4 = aVar28;
  aVar31 = aVar29;
  while( true ) {
    bVar24 = taskCount == 0;
    taskCount = taskCount - 1;
    auVar26 = auVar27._0_16_;
    if (bVar24) break;
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar19 + -8))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar31;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar19 + -6) = aVar4;
    (((BBox3fa *)(psVar19 + -4))->lower).field_0 = aVar29;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar19 + -2) = aVar28;
    *(undefined1 (*) [16])psVar19 = auVar26;
    aVar31.m128 = (__m128)vminps_avx(aVar31.m128,*(undefined1 (*) [16])(psVar19 + -0x288));
    aVar4.m128 = (__m128)vmaxps_avx(aVar4.m128,*(undefined1 (*) [16])(psVar19 + -0x286));
    aVar29.m128 = (__m128)vminps_avx(aVar29.m128,*(undefined1 (*) [16])(psVar19 + -0x284));
    aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,*(undefined1 (*) [16])(psVar19 + -0x282));
    auVar26 = vpaddq_avx(auVar26,*(undefined1 (*) [16])(psVar19 + -0x280));
    auVar27 = ZEXT1664(auVar26);
    psVar19 = psVar19 + 10;
  }
  (pPVar9->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar31;
  (pPVar9->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar4;
  (pPVar9->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar29;
  (pPVar9->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar28;
  pPVar9->begin = auVar26._0_8_;
  pPVar9->end = auVar26._8_8_;
  return pPVar9;
}

Assistant:

PrimInfo createPrimRefArrayGrids(GridMesh* mesh, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids)
    {
      unsigned int geomID_ = std::numeric_limits<unsigned int>::max ();

      PrimInfo pinfo(empty);
      size_t numPrimitives = 0;
      
      ParallelPrefixSumState<PrimInfo> pstate;
      /* iterate over all grids in a single mesh */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo
                                   {
                                     PrimInfo pinfo(empty);
                                     for (size_t j=r.begin(); j<r.end(); j++)
                                     {
                                       if (!mesh->valid(j)) continue;
                                       BBox3fa bounds = empty;
                                       const PrimRef prim(bounds,geomID_,unsigned(j));
                                       pinfo.add_center2(prim,mesh->getNumSubGrids(j));
                                     }
                                     return pinfo;
                                   }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      numPrimitives = pinfo.size();
      /* resize arrays */
      sgrids.resize(numPrimitives); 
      prims.resize(numPrimitives); 

      /* second run to fill primrefs and SubGridBuildData arrays */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
        return mesh->createPrimRefArray(prims,sgrids,r,base.size(),geomID_);
      }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      return pinfo;
    }